

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

_Bool mi_manage_os_memory(void *start,size_t size,_Bool is_committed,_Bool is_large,_Bool is_zero,
                         int numa_node)

{
  _Bool _Var1;
  
  _Var1 = mi_manage_os_memory_ex
                    (start,size,is_committed,is_large,is_zero,numa_node,false,(mi_arena_id_t *)0x0);
  return _Var1;
}

Assistant:

bool mi_manage_os_memory(void* start, size_t size, bool is_committed, bool is_large, bool is_zero, int numa_node) mi_attr_noexcept {
  return mi_manage_os_memory_ex(start, size, is_committed, is_large, is_zero, numa_node, false /* exclusive? */, NULL);
}